

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<void>::AdapterImpl
          (AdapterImpl<void> *this,PromiseFulfiller<void> *fulfiller,Canceler *canceler,
          Promise<void> *inner)

{
  Type local_40;
  Promise<void> local_38;
  Promise<void> *local_28;
  Promise<void> *inner_local;
  Canceler *canceler_local;
  PromiseFulfiller<void> *fulfiller_local;
  AdapterImpl<void> *this_local;
  
  local_28 = inner;
  inner_local = (Promise<void> *)canceler;
  canceler_local = (Canceler *)fulfiller;
  fulfiller_local = (PromiseFulfiller<void> *)this;
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_00cdc588;
  this->fulfiller = (PromiseFulfiller<void> *)canceler_local;
  local_40.fulfiller = (PromiseFulfiller<void> *)canceler_local;
  Promise<void>::
  then<kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1>
            (&local_38,(Type *)inner,&local_40);
  Promise<void>::eagerlyEvaluate(&this->inner,&local_38);
  Promise<void>::~Promise(&local_38);
  return;
}

Assistant:

Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>& fulfiller,
            Canceler& canceler, kj::Promise<void> inner)
    : AdapterBase(canceler),
      fulfiller(fulfiller),
      inner(inner.then(
          [&fulfiller]() { fulfiller.fulfill(); },
          [&fulfiller](kj::Exception&& e) { fulfiller.reject(kj::mv(e)); })
          .eagerlyEvaluate(nullptr)) {}